

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::_abi_1_10::Zone::reset(Zone *this,ResetPolicy resetPolicy)

{
  Block *pBVar1;
  uint8_t *puVar2;
  int in_ESI;
  undefined8 *in_RDI;
  Block *prev;
  Block *next;
  Block *initial;
  Block *cur;
  Block *in_stack_ffffffffffffffd8;
  Block *pBVar3;
  Zone *in_stack_ffffffffffffffe0;
  undefined1 *this_00;
  Block *local_18;
  
  local_18 = (Block *)in_RDI[2];
  if (local_18 != (Block *)_zeroBlock) {
    if (in_ESI == 1) {
      this_00 = _zeroBlock;
      puVar2 = Block::data((Block *)_zeroBlock);
      *in_RDI = puVar2;
      puVar2 = Block::data((Block *)this_00);
      in_RDI[1] = puVar2;
      in_RDI[2] = this_00;
      pBVar3 = *(Block **)((long)local_18 + 8);
      pBVar1 = local_18;
      do {
        local_18 = pBVar1;
        pBVar1 = local_18->prev;
        if ((pBVar1 == (Block *)0x0) && (((ulong)in_RDI[3] >> 0x3c & 1) != 0)) {
          *(long *)local_18 = 0;
          *(long *)((long)local_18 + 8) = 0;
          _assignBlock((Zone *)this_00,pBVar3);
          local_18 = pBVar3;
          break;
        }
        free(local_18);
        local_18 = pBVar3;
      } while (pBVar1 != (Block *)0x0);
      while (local_18 != (Block *)0x0) {
        pBVar3 = local_18->next;
        free(local_18);
        local_18 = pBVar3;
      }
    }
    else {
      for (; *(long *)local_18 != 0; local_18 = local_18->prev) {
      }
      _assignBlock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void Zone::reset(ResetPolicy resetPolicy) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &_zeroBlock)
    return;

  if (resetPolicy == ResetPolicy::kHard) {
    Block* initial = const_cast<Zone::Block*>(&_zeroBlock);
    _ptr = initial->data();
    _end = initial->data();
    _block = initial;

    // Since cur can be in the middle of the double-linked list, we have to traverse both directions (`prev` and
    // `next`) separately to visit all.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;

      // If this is the first block and this ZoneTmp is temporary then the first block is statically allocated.
      // We cannot free it and it makes sense to keep it even when this is hard reset.
      if (prev == nullptr && _isTemporary) {
        cur->prev = nullptr;
        cur->next = nullptr;
        _assignBlock(cur);
        break;
      }

      ::free(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      ::free(cur);
      cur = next;
    }
  }
  else {
    while (cur->prev)
      cur = cur->prev;
    _assignBlock(cur);
  }
}